

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_control.c
# Opt level: O1

int volume_control_segment_start(mixed_segment *segment)

{
  long *plVar1;
  
  plVar1 = (long *)segment->data;
  if ((((plVar1[2] != 0) && (*plVar1 != 0)) && (plVar1[3] != 0)) && (plVar1[1] != 0)) {
    return 1;
  }
  mixed_err(0x16);
  return 0;
}

Assistant:

int volume_control_segment_start(struct mixed_segment *segment){
  struct volume_control_segment_data *data = (struct volume_control_segment_data *)segment->data;
  if(data->out[0] == 0 || data->in[0] == 0
  || data->out[1] == 0 || data->in[1] == 0){
    mixed_err(MIXED_BUFFER_MISSING);
    return 0;
  }
  return 1;
}